

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void WriteVars(FILE *file,SDWORD *vars,size_t count,DWORD id)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  DWORD var;
  FPNGChunkArchive arc;
  DWORD local_32c;
  FPNGChunkArchive local_328;
  
  if (count == 0) {
    return;
  }
  uVar1 = 0;
  while (vars[uVar1] == 0) {
    uVar1 = uVar1 + 1;
    if (count == uVar1) {
      return;
    }
  }
  uVar2 = count - 1;
  if (uVar1 < count - 1) {
    uVar2 = uVar1;
  }
  do {
    count = count - 1;
    uVar3 = uVar2;
    if (count <= uVar1) break;
    uVar3 = count;
  } while (vars[count] == 0);
  FPNGChunkArchive::FPNGChunkArchive(&local_328,file,id);
  uVar1 = 0;
  do {
    local_32c = vars[uVar1];
    FArchive::operator<<(&local_328.super_FArchive,&local_32c);
    uVar1 = uVar1 + 1;
  } while (uVar1 <= uVar3);
  FPNGChunkArchive::~FPNGChunkArchive(&local_328);
  return;
}

Assistant:

static void WriteVars (FILE *file, SDWORD *vars, size_t count, DWORD id)
{
	size_t i, j;

	for (i = 0; i < count; ++i)
	{
		if (vars[i] != 0)
			break;
	}
	if (i < count)
	{
		// Find last non-zero var. Anything beyond the last stored variable
		// will be zeroed at load time.
		for (j = count-1; j > i; --j)
		{
			if (vars[j] != 0)
				break;
		}
		FPNGChunkArchive arc (file, id);
		for (i = 0; i <= j; ++i)
		{
			DWORD var = vars[i];
			arc << var;
		}
	}
}